

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O3

void __thiscall encoder_rate_adapt_demo_Test::TestBody(encoder_rate_adapt_demo_Test *this)

{
  ostream *poVar1;
  array<bool,_1024UL> ratead_synd;
  array<bool,_2048UL> syndrome;
  array<bool,_1024UL> aStack_2428;
  array<bool,_2048UL> local_2028;
  array<bool,_6144UL> local_1828;
  
  memset(local_1828._M_elems + 4,0,0x17fc);
  local_1828._M_elems[8] = true;
  local_1828._M_elems[9] = true;
  local_1828._M_elems[0] = true;
  local_1828._M_elems[1] = true;
  local_1828._M_elems[2] = true;
  local_1828._M_elems[3] = true;
  memset(&local_2028,0,0x800);
  memset(&aStack_2428,0,0x400);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  HelpersForTests::print_nz_inds<std::array<bool,6144ul>>(&local_1828);
  LDPC4QKD::encode<bool>(&local_1828,&local_2028);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  HelpersForTests::print_nz_inds<std::array<bool,2048ul>>(&local_2028);
  LDPC4QKD::rate_adapt<bool,1024ul>(&local_2028,&aStack_2428);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------------------------\n",0x19);
  HelpersForTests::print_nz_inds<std::array<bool,1024ul>>(&aStack_2428);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

TEST(encoder, rate_adapt_demo) {
    std::array<Bit, AutogenLDPC::N> input{
        1,1,1,1,0,0,0,0,1,1};
    std::array<Bit, AutogenLDPC::M> syndrome{};
    constexpr std::size_t rate_adaption_steps = AutogenRateAdapt::rows.size() / 2;
    std::array<Bit, AutogenLDPC::M - rate_adaption_steps> ratead_synd{};
//    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);

    std::cout << "------------------------\n";
    print_nz_inds(input);

    encode(input, syndrome);

    std::cout << "------------------------\n";
    print_nz_inds(syndrome);

    rate_adapt(syndrome, ratead_synd);

    std::cout << "------------------------\n";
    print_nz_inds(ratead_synd);
    std::cout << ratead_synd.size() << std::endl;
}